

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.h
# Opt level: O0

void __thiscall
llbuild::buildsystem::ShellCommand::getShortDescription
          (ShellCommand *this,SmallVectorImpl<char> *result)

{
  StringRef Str;
  raw_svector_ostream local_48;
  SmallVectorImpl<char> *local_18;
  SmallVectorImpl<char> *result_local;
  ShellCommand *this_local;
  
  local_18 = result;
  result_local = (SmallVectorImpl<char> *)this;
  llvm::raw_svector_ostream::raw_svector_ostream(&local_48,result);
  Str = ExternalCommand::getDescription(&this->super_ExternalCommand);
  llvm::raw_ostream::operator<<((raw_ostream *)&local_48,Str);
  llvm::raw_svector_ostream::~raw_svector_ostream(&local_48);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << getDescription();
  }